

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<double>_>::Decompose_Cholesky
          (TPZMatrix<Fad<double>_> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  value_type vVar2;
  double dVar3;
  undefined4 uVar4;
  list<long,_std::allocator<long>_> *plVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  int extraout_var;
  _List_node_base *p_Var9;
  double *pdVar10;
  double *pdVar11;
  int i;
  ulong uVar12;
  _List_node_base *p_Var13;
  double *pdVar14;
  double *pdVar15;
  _List_node_base *p_Var16;
  int i_1;
  ulong uVar17;
  double dVar18;
  Fad<double> tmp2;
  Fad<double> tmp;
  undefined1 local_158 [16];
  EVP_PKEY_CTX *local_148;
  double *pdStack_140;
  double local_138;
  _List_node_base *local_130;
  Fad<double> local_128;
  Fad<double> local_108;
  Fad<double> local_e8;
  double local_c8;
  undefined8 uStack_c0;
  _List_node_base *local_b0;
  undefined1 local_a8 [16];
  double *local_98;
  double local_90;
  _List_node_base *local_88;
  FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_> local_80;
  list<long,_std::allocator<long>_> *local_70;
  Fad<double> *local_68;
  Fad<double> local_60;
  Fad<double> *local_40;
  undefined1 *local_38;
  
  cVar6 = (this->super_TPZBaseMatrix).fDecomposed;
  local_70 = singular;
  if ((cVar6 != '\0') && (cVar6 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar6 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar6 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_b0 = (_List_node_base *)CONCAT44(extraout_var,iVar7);
    if (local_b0 != (_List_node_base *)0x0 && -1 < extraout_var) {
      p_Var16 = (_List_node_base *)0x0;
      do {
        local_130 = p_Var16;
        if (p_Var16 != (_List_node_base *)0x0) {
          p_Var9 = (_List_node_base *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_128,this,p_Var16,p_Var16);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_e8,this,p_Var16,p_Var9);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_108,this,p_Var16,p_Var9);
            local_80.left_ = &local_e8;
            local_a8._0_8_ = &local_128;
            local_158._0_8_ = local_128.val_ - local_e8.val_ * local_108.val_;
            uVar8 = local_108.dx_.num_elts;
            if (local_108.dx_.num_elts < local_e8.dx_.num_elts) {
              uVar8 = local_e8.dx_.num_elts;
            }
            if ((int)uVar8 < local_128.dx_.num_elts) {
              uVar8 = local_128.dx_.num_elts;
            }
            local_158._8_4_ = 0;
            local_148 = (EVP_PKEY_CTX *)0x0;
            local_a8._8_8_ = &local_80;
            local_80.right_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_108;
            if ((int)uVar8 < 1) {
              pdStack_140 = (double *)0x0;
            }
            else {
              local_158._8_4_ = uVar8;
              local_148 = (EVP_PKEY_CTX *)operator_new__((ulong)uVar8 * 8);
              pdStack_140 = (double *)0x0;
              uVar12 = 0;
              do {
                vVar2 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                        ::dx((FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                              *)local_a8,(int)uVar12);
                *(value_type *)(local_148 + uVar12 * 8) = vVar2;
                uVar12 = uVar12 + 1;
              } while (uVar8 != uVar12);
            }
            p_Var16 = local_130;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,local_130,local_130,local_158);
            Fad<double>::~Fad((Fad<double> *)local_158);
            Fad<double>::~Fad(&local_108);
            Fad<double>::~Fad(&local_e8);
            Fad<double>::~Fad(&local_128);
            p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 1);
          } while (p_Var9 != p_Var16);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_158,this,p_Var16,p_Var16);
        local_c8 = ABS((double)local_158._0_8_);
        uStack_c0 = 0;
        local_128.val_ = 1e-12;
        local_128.dx_.num_elts = 0;
        local_128.dx_.ptr_to_data = (double *)0x0;
        local_128.defaultVal = 0.0;
        Fad<double>::~Fad(&local_128);
        Fad<double>::~Fad((Fad<double> *)local_158);
        if (local_c8 <= 1e-12) {
          p_Var9 = (_List_node_base *)operator_new(0x18);
          plVar5 = local_70;
          p_Var9[1]._M_next = p_Var16;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          psVar1 = &(plVar5->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_158._0_8_ = 1.0;
          local_158._8_4_ = 0;
          local_148 = (EVP_PKEY_CTX *)0x0;
          pdStack_140 = (double *)0x0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var16,p_Var16,local_158);
          Fad<double>::~Fad((Fad<double> *)local_158);
          p_Var16 = local_130;
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_108,this,p_Var16,p_Var16);
        FadFuncSqrt<Fad<double>_>::FadFuncSqrt((FadFuncSqrt<Fad<double>_> *)&local_128,&local_108);
        FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_158,
                   (FadFuncSqrt<Fad<double>_> *)&local_128);
        Fad<double>::~Fad(&local_128);
        dVar3 = (double)CONCAT44(local_158._12_4_,local_158._8_4_);
        if (dVar3 < 0.0) {
          local_e8.val_ = sqrt(dVar3);
        }
        else {
          local_e8.val_ = SQRT(dVar3);
        }
        local_e8.dx_.num_elts = 0;
        local_e8.dx_.ptr_to_data = (double *)0x0;
        if ((long)(int)(uint)local_148 < 1) {
          local_e8.defaultVal = 0.0;
        }
        else {
          local_e8.dx_.num_elts = (uint)local_148;
          uVar12 = (long)(int)(uint)local_148 * 8;
          local_e8.dx_.ptr_to_data = (double *)operator_new__(uVar12);
          local_e8.defaultVal = 0.0;
          uVar17 = 0;
          do {
            pdVar10 = (double *)((long)pdStack_140 + uVar17);
            if ((uint)local_148 == 0) {
              pdVar10 = &local_138;
            }
            dVar3 = (double)CONCAT44(local_158._12_4_,local_158._8_4_);
            if (dVar3 < 0.0) {
              local_c8 = *pdVar10;
              dVar3 = sqrt(dVar3);
              dVar18 = local_c8;
            }
            else {
              dVar3 = SQRT(dVar3);
              dVar18 = *pdVar10;
            }
            *(double *)((long)local_e8.dx_.ptr_to_data + uVar17) = dVar18 / (dVar3 + dVar3);
            uVar17 = uVar17 + 8;
          } while (uVar12 != uVar17);
        }
        Fad<double>::~Fad((Fad<double> *)(local_158 + 8));
        Fad<double>::~Fad(&local_108);
        p_Var16 = local_130;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,local_130,local_130,&local_e8);
        p_Var16 = (_List_node_base *)((long)&p_Var16->_M_next + 1);
        local_88 = p_Var16;
        if ((long)p_Var16 < (long)local_b0) {
          do {
            p_Var9 = local_130;
            if (local_130 != (_List_node_base *)0x0) {
              p_Var13 = (_List_node_base *)0x0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_128,this,p_Var9,p_Var16);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_108,this,p_Var9,p_Var13);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (local_a8,this,p_Var13,p_Var16);
                local_40 = &local_108;
                local_80.left_ = &local_128;
                local_80.right_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_40;
                local_158._0_8_ = local_128.val_ - local_108.val_ * (double)local_a8._0_8_;
                uVar8 = local_a8._8_4_;
                if ((int)local_a8._8_4_ < local_108.dx_.num_elts) {
                  uVar8 = local_108.dx_.num_elts;
                }
                if ((int)uVar8 < local_128.dx_.num_elts) {
                  uVar8 = local_128.dx_.num_elts;
                }
                local_158._8_4_ = 0;
                local_148 = (EVP_PKEY_CTX *)0x0;
                local_38 = local_a8;
                if ((int)uVar8 < 1) {
                  pdStack_140 = (double *)0x0;
                }
                else {
                  local_158._8_4_ = uVar8;
                  local_148 = (EVP_PKEY_CTX *)operator_new__((ulong)uVar8 * 8);
                  pdStack_140 = (double *)0x0;
                  uVar12 = 0;
                  do {
                    vVar2 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                            ::dx(&local_80,(int)uVar12);
                    *(value_type *)(local_148 + uVar12 * 8) = vVar2;
                    uVar12 = uVar12 + 1;
                  } while (uVar8 != uVar12);
                }
                p_Var9 = local_130;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,local_130,p_Var16,local_158);
                Fad<double>::~Fad((Fad<double> *)local_158);
                Fad<double>::~Fad((Fad<double> *)local_a8);
                Fad<double>::~Fad(&local_108);
                Fad<double>::~Fad(&local_128);
                p_Var13 = (_List_node_base *)((long)&p_Var13->_M_next + 1);
              } while (p_Var13 != p_Var9);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_158,this,p_Var9,p_Var9);
            uVar4 = local_158._8_4_;
            local_60.val_ = (double)local_158._0_8_;
            local_60.dx_.num_elts = local_158._8_4_;
            local_60.dx_.ptr_to_data = (double *)0x0;
            if ((long)(int)local_158._8_4_ != 0) {
              uVar12 = (long)(int)local_158._8_4_ * 8;
              if ((int)local_158._8_4_ < 0) {
                uVar12 = 0xffffffffffffffff;
              }
              local_60.dx_.ptr_to_data = (double *)operator_new__(uVar12);
              MEM_CPY<double>::copy
                        ((MEM_CPY<double> *)local_60.dx_.ptr_to_data,local_148,
                         (EVP_PKEY_CTX *)(ulong)(uint)uVar4);
            }
            local_60.defaultVal = (double)pdStack_140;
            local_c8 = ABS(local_60.val_);
            uStack_c0 = 0;
            Fad<double>::~Fad(&local_60);
            if (local_c8 < 1e-12) {
              Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
            }
            p_Var9 = local_130;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_108,this,local_130,p_Var16);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_a8,this,p_Var9,p_Var9);
            iVar7 = local_108.dx_.num_elts;
            local_128.val_ = local_108.val_ / (double)local_a8._0_8_;
            uVar4 = local_a8._8_4_;
            uVar8 = local_a8._8_4_;
            if ((int)local_a8._8_4_ < local_108.dx_.num_elts) {
              uVar8 = local_108.dx_.num_elts;
            }
            local_128.dx_.num_elts = 0;
            local_128.dx_.ptr_to_data = (double *)0x0;
            if (0 < (int)uVar8) {
              local_68 = (Fad<double> *)local_a8._0_8_;
              local_c8 = local_108.val_;
              local_128.dx_.num_elts = uVar8;
              local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar8 * 8);
              local_128.defaultVal = 0.0;
              uVar12 = 0;
              pdVar10 = local_108.dx_.ptr_to_data;
              pdVar11 = local_98;
              do {
                pdVar14 = pdVar10;
                if (iVar7 == 0) {
                  pdVar14 = &local_108.defaultVal;
                }
                pdVar15 = pdVar11;
                if (uVar4 == 0) {
                  pdVar15 = &local_90;
                }
                local_128.dx_.ptr_to_data[uVar12] =
                     (*pdVar14 * (double)local_68 - *pdVar15 * local_c8) /
                     ((double)local_68 * (double)local_68);
                uVar12 = uVar12 + 1;
                pdVar11 = pdVar11 + 1;
                pdVar10 = pdVar10 + 1;
              } while (uVar8 != uVar12);
            }
            p_Var9 = local_130;
            local_128.defaultVal = 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,local_130,p_Var16,&local_128);
            Fad<double>::~Fad(&local_128);
            Fad<double>::~Fad((Fad<double> *)local_a8);
            Fad<double>::~Fad(&local_108);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_128,this,p_Var9,p_Var16);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,p_Var16,p_Var9,&local_128);
            Fad<double>::~Fad(&local_128);
            Fad<double>::~Fad((Fad<double> *)local_158);
            p_Var16 = (_List_node_base *)((long)&p_Var16->_M_next + 1);
          } while ((long)p_Var16 < (long)local_b0);
        }
        Fad<double>::~Fad(&local_e8);
        p_Var16 = local_88;
      } while (local_88 != local_b0);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}